

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::LRUCache::Lookup(LRUCache *this,Slice *key,uint32_t hash)

{
  LRUHandle *e_00;
  LRUHandle *e;
  MutexLock l;
  uint32_t hash_local;
  Slice *key_local;
  LRUCache *this_local;
  
  l.mu_._4_4_ = hash;
  MutexLock::MutexLock((MutexLock *)&e,&this->mutex_);
  e_00 = HandleTable::Lookup(&this->table_,key,l.mu_._4_4_);
  if (e_00 != (LRUHandle *)0x0) {
    e_00->refs = e_00->refs + 1;
    LRU_Remove(this,e_00);
    LRU_Append(this,e_00);
  }
  MutexLock::~MutexLock((MutexLock *)&e);
  return (Handle *)e_00;
}

Assistant:

Cache::Handle *LRUCache::Lookup(const Slice &key, uint32_t hash) {
            MutexLock l(&mutex_);
            LRUHandle *e = table_.Lookup(key, hash);
            if (e != NULL) {
                e->refs++;
                LRU_Remove(e);
                LRU_Append(e);
            }
            return reinterpret_cast<Cache::Handle *>(e);
        }